

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::CopyTextureRegion
          (DeviceContextVkImpl *this,TextureVkImpl *pSrcTexture,
          RESOURCE_STATE_TRANSITION_MODE SrcTextureTransitionMode,TextureVkImpl *pDstTexture,
          RESOURCE_STATE_TRANSITION_MODE DstTextureTransitionMode,VkImageCopy *CopyRegion)

{
  Uint32 *pUVar1;
  
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTextureState
            (this,pSrcTexture,SrcTextureTransitionMode,RESOURCE_STATE_COPY_SOURCE,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             "Using texture as transfer source (DeviceContextVkImpl::CopyTextureRegion)");
  TransitionOrVerifyTextureState
            (this,pDstTexture,DstTextureTransitionMode,RESOURCE_STATE_COPY_DEST,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             "Using texture as transfer destination (DeviceContextVkImpl::CopyTextureRegion)");
  VulkanUtilities::VulkanCommandBuffer::CopyImage
            (&this->m_CommandBuffer,(pSrcTexture->m_VulkanImage).m_VkObject,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(pDstTexture->m_VulkanImage).m_VkObject,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,CopyRegion);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::CopyTextureRegion(TextureVkImpl*                 pSrcTexture,
                                            RESOURCE_STATE_TRANSITION_MODE SrcTextureTransitionMode,
                                            TextureVkImpl*                 pDstTexture,
                                            RESOURCE_STATE_TRANSITION_MODE DstTextureTransitionMode,
                                            const VkImageCopy&             CopyRegion)
{
    EnsureVkCmdBuffer();
    TransitionOrVerifyTextureState(*pSrcTexture, SrcTextureTransitionMode, RESOURCE_STATE_COPY_SOURCE, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                                   "Using texture as transfer source (DeviceContextVkImpl::CopyTextureRegion)");
    TransitionOrVerifyTextureState(*pDstTexture, DstTextureTransitionMode, RESOURCE_STATE_COPY_DEST, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                   "Using texture as transfer destination (DeviceContextVkImpl::CopyTextureRegion)");

    // srcImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL
    // dstImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL (18.3)
    m_CommandBuffer.CopyImage(pSrcTexture->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, pDstTexture->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &CopyRegion);
    ++m_State.NumCommands;
}